

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::InvalidContextCase::iterate(InvalidContextCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  EGLDisplay display;
  bool bVar3;
  int iVar4;
  int iVar5;
  Library *egl;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  Enum<int,_2UL> local_1f8;
  EGLint attribList [7];
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  egl = EglTestContext::getLibrary((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx);
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "EGL_BAD_ATTRIBUTE is generated if EXT_create_context_robustness is NOT supported but EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT is specified\n\n"
                 );
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  attribList[4] = 0x3138;
  attribList[5] = 0x31bf;
  attribList[6] = 0x3038;
  attribList[0] = 0x3098;
  attribList[1] = 3;
  attribList[2] = 0x30fb;
  attribList[3] = 1;
  display = (this->super_RobustnessTestCase).m_eglDisplay;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"EGL_EXT_create_context_robustness",(allocator<char> *)&local_1f8)
  ;
  bVar3 = eglu::hasExtension(egl,display,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (bVar3) {
    this_00 = (this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Test requires EGL_EXT_create_context_robustness to be unsupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    logAttribList((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList);
    iVar4 = (*egl->_vptr_Library[6])
                      (egl,(this->super_RobustnessTestCase).m_eglDisplay,
                       (this->super_RobustnessTestCase).m_eglConfig,0,attribList);
    iVar5 = (*egl->_vptr_Library[0x1f])(egl);
    if (iVar5 != 0x3004) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Test failed! eglCreateContext() returned with error [");
      local_1f8.m_getName = eglu::getErrorName;
      local_1f8.m_value = iVar5;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f8,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,", expected ");
      local_1c0.m_getName = eglu::getErrorName;
      local_1c0.m_value = 0x3004;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1,"]");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    if (CONCAT44(extraout_var,iVar4) != 0) {
      (*egl->_vptr_Library[0x13])
                (egl,(this->super_RobustnessTestCase).m_eglDisplay,CONCAT44(extraout_var,iVar4));
    }
    this_00 = (this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    if (iVar5 == 0x3004) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();
		bool			isOk	= true;

		log << tcu::TestLog::Message
			<< "EGL_BAD_ATTRIBUTE is generated if EXT_create_context_robustness is NOT supported but EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT is specified\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		if (eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_create_context_robustness"))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test requires EGL_EXT_create_context_robustness to be unsupported");
			return STOP;
		}

		logAttribList(m_eglTestCtx, attribList);
		EGLContext context = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, attribList);

		const EGLenum error = egl.getError();
		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message
				<< "Test failed! eglCreateContext() returned with error [" << eglu::getErrorStr(error) << ", expected " << eglu::getErrorStr(EGL_BAD_ATTRIBUTE) << "]"
				<< TestLog::EndMessage;

			isOk = false;
		}

		if (context != EGL_NO_CONTEXT)
			egl.destroyContext(m_eglDisplay, context);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}